

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

int __thiscall cmVSLink::Link(cmVSLink *this)

{
  int iVar1;
  char *pcVar2;
  
  if (this->Incremental == true) {
    if ((this->LinkGeneratesManifest != false) ||
       ((this->UserManifests).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->UserManifests).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      if (this->Verbose == true) {
        std::operator<<((ostream *)&std::cout,
                        "Visual Studio Incremental Link with embedded manifests\n");
      }
      iVar1 = LinkIncremental(this);
      return iVar1;
    }
    if (this->Verbose == false) goto LAB_002696d9;
    pcVar2 = "Visual Studio Incremental Link without manifests\n";
  }
  else {
    if (this->Verbose != true) goto LAB_002696d9;
    pcVar2 = "Visual Studio Non-Incremental Link\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
LAB_002696d9:
  iVar1 = LinkNonIncremental(this);
  return iVar1;
}

Assistant:

int cmVSLink::Link()
{
  if (this->Incremental &&
      (this->LinkGeneratesManifest || !this->UserManifests.empty()))
    {
    if (this->Verbose)
      {
      std::cout << "Visual Studio Incremental Link with embedded manifests\n";
      }
    return LinkIncremental();
    }
  if (this->Verbose)
    {
    if (!this->Incremental)
      {
      std::cout << "Visual Studio Non-Incremental Link\n";
      }
    else
      {
      std::cout << "Visual Studio Incremental Link without manifests\n";
      }
    }
  return LinkNonIncremental();
}